

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O3

_Bool duckdb_je_ckh_new(tsd_t *tsd,ckh_t *ckh,size_t minitems,ckh_hash_t *ckh_hash,
                       ckh_keycomp_t *keycomp)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uintptr_t uVar4;
  void *pvVar5;
  arena_t *paVar6;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  ckhc_t *key;
  rtree_leaf_elm_t *prVar10;
  atomic_p_t arena;
  long lVar11;
  byte bVar12;
  uintptr_t uVar13;
  uint uVar14;
  ulong uVar15;
  uintptr_t *puVar16;
  size_t usize;
  _Bool _Var17;
  
  ckh->prng_state = 0x2a;
  ckh->count = 0;
  uVar14 = 0xffffffff;
  do {
    bVar12 = (char)uVar14 + 3;
    uVar14 = uVar14 + 1;
  } while ((ulong)(1L << (bVar12 & 0x3f)) < (minitems + (minitems % 3 ^ 3)) / 3 << 2);
  ckh->lg_minbuckets = uVar14;
  ckh->lg_curbuckets = uVar14;
  uVar9 = 0x10L << (bVar12 & 0x3f);
  ckh->hash = ckh_hash;
  ckh->keycomp = keycomp;
  if (uVar9 < 0x3801) {
    uVar14 = (int)uVar9 + 0x3fU & 0x7fc0;
    if (uVar14 < 0x1001) {
      usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar14 >> 3]];
    }
    else {
      uVar9 = (ulong)uVar14 * 2 - 1;
      lVar11 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      uVar9 = -1L << (0x3c - ((byte)lVar11 ^ 0x3f) & 0x3f);
      usize = ~uVar9 + (ulong)uVar14 & uVar9;
    }
    uVar15 = 0x4000;
    if (usize < 0x4000) goto LAB_00cee57f;
  }
  else {
    uVar15 = 0x4000;
    if (0x4000 < uVar9) {
      if (uVar9 < 0x7000000000000001) {
        uVar15 = (0x20L << (bVar12 & 0x3f)) - 1;
        lVar11 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        uVar15 = -1L << (0x3c - ((byte)lVar11 ^ 0x3f) & 0x3f);
        uVar15 = ~uVar15 + uVar9 & uVar15;
      }
      else {
        uVar15 = 0;
      }
      if (uVar15 < uVar9) {
        return true;
      }
    }
  }
  usize = 0;
  if (!CARRY8(duckdb_je_sz_large_pad,uVar15)) {
    usize = uVar15;
  }
LAB_00cee57f:
  if (usize + 0x8fffffffffffffff < 0x9000000000000000) {
    _Var17 = true;
  }
  else {
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
      arena.repr = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena;
      if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena == (arena_t *)0x0) &&
         (arena.repr = duckdb_je_arena_choose_hard(tsd,true),
         tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true)) {
        paVar6 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena;
        if (paVar6 == (arena_t *)0x0) {
          duckdb_je_tcache_arena_associate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                     (arena_t *)arena.repr);
        }
        else if (paVar6 != (arena_t *)arena.repr) {
          duckdb_je_tcache_arena_reassociate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                     (arena_t *)arena.repr);
        }
      }
    }
    else {
      arena = duckdb_je_arenas[0];
      if (duckdb_je_arenas[0].repr == (void *)0x0) {
        arena.repr = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
      }
    }
    key = (ckhc_t *)
          duckdb_je_arena_palloc
                    ((tsdn_t *)tsd,(arena_t *)arena.repr,usize,0x40,true,usize < 0x3801,
                     (tcache_t *)0x0);
    _Var17 = key == (ckhc_t *)0x0;
    if (!_Var17) {
      uVar9 = (ulong)key & 0xffffffffc0000000;
      uVar14 = ((uint)((ulong)key >> 0x1e) & 0xf) << 4;
      puVar16 = (uintptr_t *)
                ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                        [0].leafkey + (ulong)uVar14);
      uVar4 = *puVar16;
      uVar13 = uVar9;
      if (uVar4 == uVar9) {
        prVar10 = (rtree_leaf_elm_t *)
                  ((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) +
                  *(long *)((long)&(tsd->
                                   cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                                   cache[0].leaf + (ulong)uVar14));
      }
      else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
               leafkey == uVar9) {
        prVar10 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0]
                  .leaf;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
             uVar4;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
             *(rtree_leaf_elm_t **)
              ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                      [0].leaf + (ulong)uVar14);
        *puVar16 = uVar9;
        *(rtree_leaf_elm_t **)
         ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].
                 leaf + (ulong)uVar14) = prVar10;
        prVar10 = (rtree_leaf_elm_t *)
                  ((long)&(prVar10->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
      }
      else {
        lVar11 = 0x2d0;
        do {
          if (*(ulong *)((long)tsd + lVar11 + -8) == uVar9) {
            lVar7 = *(long *)(&tsd->
                               cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                             + lVar11);
            puVar2 = (undefined8 *)((long)tsd + lVar11 + -0x18);
            uVar8 = puVar2[1];
            puVar3 = (undefined8 *)((long)tsd + lVar11 + -8);
            *puVar3 = *puVar2;
            puVar3[1] = uVar8;
            *(uintptr_t *)((long)tsd + lVar11 + -0x18) = uVar4;
            *(undefined8 *)((long)tsd + lVar11 + -0x10) =
                 *(undefined8 *)
                  ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                          cache[0].leaf + (ulong)uVar14);
            *puVar16 = uVar9;
            *(long *)((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                             cache[0].leaf + (ulong)uVar14) = lVar7;
            prVar10 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + lVar7);
            goto LAB_00cee634;
          }
          lVar11 = lVar11 + 0x10;
        } while (lVar11 != 0x340);
        prVar10 = duckdb_je_rtree_leaf_elm_lookup_hard
                            ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,
                             &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
                             (uintptr_t)key,true,false);
        uVar13 = *puVar16;
      }
LAB_00cee634:
      pvVar5 = duckdb_je_arenas
               [*(uint *)(((long)(prVar10->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
                0xfff].repr;
      if (uVar13 == uVar9) {
        prVar10 = (rtree_leaf_elm_t *)
                  ((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) +
                  *(long *)((long)&(tsd->
                                   cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                                   cache[0].leaf + (ulong)uVar14));
      }
      else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
               leafkey == uVar9) {
        prVar10 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0]
                  .leaf;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
             uVar13;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
             *(rtree_leaf_elm_t **)
              ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                      [0].leaf + (ulong)uVar14);
        *puVar16 = uVar9;
        *(rtree_leaf_elm_t **)
         ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].
                 leaf + (ulong)uVar14) = prVar10;
        prVar10 = (rtree_leaf_elm_t *)
                  ((long)&(prVar10->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
      }
      else {
        lVar11 = 0x2d0;
        do {
          if (*(ulong *)((long)tsd + lVar11 + -8) == uVar9) {
            lVar7 = *(long *)(&tsd->
                               cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                             + lVar11);
            puVar2 = (undefined8 *)((long)tsd + lVar11 + -0x18);
            uVar8 = puVar2[1];
            puVar3 = (undefined8 *)((long)tsd + lVar11 + -8);
            *puVar3 = *puVar2;
            puVar3[1] = uVar8;
            *(uintptr_t *)((long)tsd + lVar11 + -0x18) = uVar13;
            *(undefined8 *)((long)tsd + lVar11 + -0x10) =
                 *(undefined8 *)
                  ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                          cache[0].leaf + (ulong)uVar14);
            *puVar16 = uVar9;
            *(long *)((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                             cache[0].leaf + (ulong)uVar14) = lVar7;
            prVar10 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + lVar7);
            goto LAB_00cee66d;
          }
          lVar11 = lVar11 + 0x10;
        } while (lVar11 != 0x340);
        prVar10 = duckdb_je_rtree_leaf_elm_lookup_hard
                            ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,
                             &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
                             (uintptr_t)key,true,false);
      }
LAB_00cee66d:
      LOCK();
      plVar1 = (long *)((long)pvVar5 + 0x48);
      *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[(ulong)(prVar10->le_bits).repr >> 0x30];
      UNLOCK();
    }
    ckh->tab = key;
  }
  return _Var17;
}

Assistant:

bool
ckh_new(tsd_t *tsd, ckh_t *ckh, size_t minitems, ckh_hash_t *ckh_hash,
    ckh_keycomp_t *keycomp) {
	bool ret;
	size_t mincells, usize;
	unsigned lg_mincells;

	assert(minitems > 0);
	assert(ckh_hash != NULL);
	assert(keycomp != NULL);

#ifdef CKH_COUNT
	ckh->ngrows = 0;
	ckh->nshrinks = 0;
	ckh->nshrinkfails = 0;
	ckh->ninserts = 0;
	ckh->nrelocs = 0;
#endif
	ckh->prng_state = 42; /* Value doesn't really matter. */
	ckh->count = 0;

	/*
	 * Find the minimum power of 2 that is large enough to fit minitems
	 * entries.  We are using (2+,2) cuckoo hashing, which has an expected
	 * maximum load factor of at least ~0.86, so 0.75 is a conservative load
	 * factor that will typically allow mincells items to fit without ever
	 * growing the table.
	 */
	assert(LG_CKH_BUCKET_CELLS > 0);
	mincells = ((minitems + (3 - (minitems % 3))) / 3) << 2;
	for (lg_mincells = LG_CKH_BUCKET_CELLS;
	    (ZU(1) << lg_mincells) < mincells;
	    lg_mincells++) {
		/* Do nothing. */
	}
	ckh->lg_minbuckets = lg_mincells - LG_CKH_BUCKET_CELLS;
	ckh->lg_curbuckets = lg_mincells - LG_CKH_BUCKET_CELLS;
	ckh->hash = ckh_hash;
	ckh->keycomp = keycomp;

	usize = sz_sa2u(sizeof(ckhc_t) << lg_mincells, CACHELINE);
	if (unlikely(usize == 0 || usize > SC_LARGE_MAXCLASS)) {
		ret = true;
		goto label_return;
	}
	ckh->tab = (ckhc_t *)ipallocztm(tsd_tsdn(tsd), usize, CACHELINE, true,
	    NULL, true, arena_ichoose(tsd, NULL));
	if (ckh->tab == NULL) {
		ret = true;
		goto label_return;
	}

	ret = false;
label_return:
	return ret;
}